

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

string * soul::trimCharacterAtStart(string *__return_storage_ptr__,string *s,char charToRemove)

{
  bool bVar1;
  reference pcVar2;
  allocator<char> local_41;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  const_iterator c;
  char charToRemove_local;
  string *s_local;
  
  c._M_current._7_1_ = charToRemove;
  local_28._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_30._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    if (*pcVar2 != c._M_current._7_1_) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  local_38._M_current = local_28._M_current;
  local_40._M_current = (char *)std::__cxx11::string::end();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)__return_storage_ptr__,local_38,local_40,&local_41);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string trimCharacterAtStart (const std::string& s, char charToRemove)
{
    for (auto c = s.begin(); c != s.end(); ++c)
        if (*c != charToRemove)
            return { c, s.end() };

    return {};
}